

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall t_ocaml_generator::generate_const(t_ocaml_generator *this,t_const *tconst)

{
  ostream *poVar1;
  string local_98;
  t_const_value *local_78;
  t_const_value *value;
  string local_60;
  undefined1 local_40 [8];
  string name;
  t_type *type;
  t_const *tconst_local;
  t_ocaml_generator *this_local;
  
  name.field_2._8_8_ = t_const::get_type(tconst);
  t_const::get_name_abi_cxx11_(&local_60,tconst);
  t_generator::decapitalize((string *)local_40,(t_generator *)this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = t_const::get_value(tconst);
  poVar1 = t_generator::indent((t_generator *)this,(ostream *)&this->f_consts_);
  poVar1 = std::operator<<(poVar1,"let ");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  poVar1 = std::operator<<(poVar1," = ");
  render_const_value_abi_cxx11_(&local_98,this,(t_type *)name.field_2._8_8_,local_78);
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_ocaml_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = decapitalize(tconst->get_name());
  t_const_value* value = tconst->get_value();

  indent(f_consts_) << "let " << name << " = " << render_const_value(type, value) << endl << endl;
}